

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometrycollection.cpp
# Opt level: O0

Primitive * newPrimitive(Json *conf)

{
  point p;
  vec3f vn1;
  vec3f vn2;
  vec3f vn3;
  bool bVar1;
  Triangle *pTVar2;
  runtime_error *this;
  vec3f vVar3;
  Triangle *tshape;
  vec2f t3;
  vec2f t2;
  vec2f t1;
  bool recompute_normal;
  vec3f n3;
  vec3f n2;
  vec3f n1;
  vec3f v3;
  vec3f v2;
  vec3f v1;
  Primitive *shape;
  vec2f in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  float in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  Plane *in_stack_fffffffffffffb80;
  char (*key) [18];
  undefined4 in_stack_fffffffffffffb88;
  float fVar4;
  float in_stack_fffffffffffffb8c;
  const_reference in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  Json *in_stack_fffffffffffffbb0;
  Triangle *in_stack_fffffffffffffbd8;
  Triangle *in_stack_fffffffffffffbe0;
  Triangle *in_stack_fffffffffffffbe8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffbf0;
  Json *in_stack_fffffffffffffc68;
  RevSurface *in_stack_fffffffffffffc70;
  string local_360 [96];
  vec3f local_300;
  vec3f local_2f0;
  vec3f local_2e0;
  vec3f local_2d0;
  char (*local_2c0) [18];
  float local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  float local_2a8;
  vec2f local_2a0;
  vec2f local_298;
  vec2f local_290;
  vec3f local_288;
  vec3f local_278;
  vec3f local_268;
  Triangle *local_258;
  vec2f in_stack_fffffffffffffdb0;
  vec2f in_stack_fffffffffffffdb8;
  vec2f in_stack_fffffffffffffdc0;
  vec3f in_stack_fffffffffffffdd8;
  vec3f in_stack_fffffffffffffdf8;
  vec2f local_1f8;
  vec2f local_1f0;
  vec2f in_stack_fffffffffffffe18;
  vec2f vVar5;
  float in_stack_fffffffffffffe20;
  float fStack_1dc;
  float in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  float in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  float in_stack_fffffffffffffe40;
  float in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  float in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  float in_stack_fffffffffffffe60;
  bool local_dd;
  vec3f local_dc;
  char (*local_d0) [18];
  float local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  float local_b8;
  vec3f local_b4;
  vec3f local_a8;
  vec3f local_98;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  Json local_30 [2];
  Triangle *local_10;
  
  local_10 = (Triangle *)0x0;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  bVar1 = nlohmann::operator==<const_char_*,_0>
                    (in_stack_fffffffffffffb90,
                     (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  fStack_1dc = in_stack_fffffffffffffe38;
  if (bVar1) {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffc68 = local_30;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffc70 =
         (RevSurface *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>_>
         ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Primitive_*>_>_>
                       *)in_stack_fffffffffffffb70,(key_type *)in_stack_fffffffffffffb68);
    local_10 = (Triangle *)
               (in_stack_fffffffffffffc70->super_ParamSurface).super_Primitive._vptr_Primitive;
    std::__cxx11::string::~string((string *)local_30);
    fStack_1dc = in_stack_fffffffffffffe38;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  bVar1 = nlohmann::operator==<const_char_*,_0>
                    (in_stack_fffffffffffffb90,
                     (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  if (bVar1) {
    pTVar2 = (Triangle *)operator_new(0x18);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    vVar3 = json2vec3f(in_stack_fffffffffffffbb0);
    local_50 = vVar3.z;
    local_58 = vVar3._0_8_;
    local_48 = local_58;
    local_40 = local_50;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator_double<double,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)0x178941);
    local_60 = local_40;
    local_68 = local_48;
    p._4_8_ = in_stack_fffffffffffffb90;
    p.x = in_stack_fffffffffffffb8c;
    Sphere::Sphere((Sphere *)in_stack_fffffffffffffb70,p,in_stack_fffffffffffffb68.y);
    local_10 = pTVar2;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  bVar1 = nlohmann::operator==<const_char_*,_0>
                    (in_stack_fffffffffffffb90,
                     (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  if (bVar1) {
    pTVar2 = (Triangle *)operator_new(0x18);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    vVar3 = json2vec3f(in_stack_fffffffffffffbb0);
    local_80 = vVar3.z;
    local_88 = vVar3._0_8_;
    local_78 = local_88;
    local_70 = local_80;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffbf0 =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_double<double,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)0x178abd);
    Plane::Plane(in_stack_fffffffffffffb80,
                 (vec3f *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 (float)((ulong)in_stack_fffffffffffffb70 >> 0x20));
    local_10 = pTVar2;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  bVar1 = nlohmann::operator==<const_char_*,_0>
                    (in_stack_fffffffffffffb90,
                     (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  if (bVar1) {
    in_stack_fffffffffffffbe8 = (Triangle *)operator_new(8);
    Cube::Cube((Cube *)in_stack_fffffffffffffb70);
    local_10 = in_stack_fffffffffffffbe8;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  bVar1 = nlohmann::operator==<const_char_*,_0>
                    (in_stack_fffffffffffffb90,
                     (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  if (bVar1) {
    in_stack_fffffffffffffbe0 = (Triangle *)operator_new(8);
    Quad::Quad((Quad *)in_stack_fffffffffffffb70);
    local_10 = in_stack_fffffffffffffbe0;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  bVar1 = nlohmann::operator==<const_char_*,_0>
                    (in_stack_fffffffffffffb90,
                     (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  if (bVar1) {
    in_stack_fffffffffffffbd8 = (Triangle *)operator_new(0x18);
    RevSurface::RevSurface(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    local_10 = in_stack_fffffffffffffbd8;
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  bVar1 = nlohmann::operator==<const_char_*,_0>
                    (in_stack_fffffffffffffb90,
                     (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  if (bVar1) {
    vec3f::vec3f(&local_98);
    vec3f::vec3f(&local_a8);
    vec3f::vec3f(&local_b4);
    vec3f::vec3f((vec3f *)&local_c0);
    vec3f::vec3f((vec3f *)&local_d0);
    vec3f::vec3f(&local_dc);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
    vVar3 = json2vec3f(in_stack_fffffffffffffbb0);
    local_98.z = vVar3.z;
    local_98._0_8_ = vVar3._0_8_;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
    vVar3 = json2vec3f(in_stack_fffffffffffffbb0);
    local_a8.z = vVar3.z;
    local_a8._0_8_ = vVar3._0_8_;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
    vVar3 = json2vec3f(in_stack_fffffffffffffbb0);
    local_b4.z = vVar3.z;
    local_b4._0_8_ = vVar3._0_8_;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[8]>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
               (char (*) [8])in_stack_fffffffffffffb80);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffb68);
    local_dd = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)in_stack_fffffffffffffb70,
                            (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)in_stack_fffffffffffffb68);
    if (local_dd) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
      vVar3 = json2vec3f(in_stack_fffffffffffffbb0);
      local_b8 = vVar3.z;
      local_c0 = vVar3._0_8_;
      in_stack_fffffffffffffe60 = vVar3.x;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
      vVar3 = json2vec3f(in_stack_fffffffffffffbb0);
      in_stack_fffffffffffffe48 = vVar3.z;
      local_d0 = vVar3._0_8_;
      in_stack_fffffffffffffe40 = vVar3.x;
      in_stack_fffffffffffffe50 = in_stack_fffffffffffffe40;
      in_stack_fffffffffffffe58 = in_stack_fffffffffffffe48;
      local_c8 = in_stack_fffffffffffffe48;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
      vVar3 = json2vec3f(in_stack_fffffffffffffbb0);
      in_stack_fffffffffffffe3c = vVar3.z;
      local_dc._0_8_ = vVar3._0_8_;
      in_stack_fffffffffffffe20 = vVar3.x;
      fStack_1dc = vVar3.y;
      in_stack_fffffffffffffe34 = in_stack_fffffffffffffe20;
      local_dc.z = in_stack_fffffffffffffe3c;
    }
    local_dd = !local_dd;
    vec2f::vec2f((vec2f *)&stack0xfffffffffffffe18);
    vec2f::vec2f(&local_1f0);
    vec2f::vec2f(&local_1f8);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[4]>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
               (char (*) [4])in_stack_fffffffffffffb80);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffb68);
    bVar1 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)in_stack_fffffffffffffb70,
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)in_stack_fffffffffffffb68);
    local_290 = in_stack_fffffffffffffe18;
    if (bVar1) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffdc0 =
           json2vec2f((Json *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      vVar5 = in_stack_fffffffffffffdc0;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffdb8 =
           json2vec2f((Json *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      local_1f0 = in_stack_fffffffffffffdb8;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffdb0 =
           json2vec2f((Json *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      local_1f8 = in_stack_fffffffffffffdb0;
      local_290 = vVar5;
    }
    pTVar2 = (Triangle *)operator_new(0xa0);
    local_268.z = local_98.z;
    local_268.x = local_98.x;
    local_268.y = local_98.y;
    local_278.z = local_a8.z;
    local_278.x = local_a8.x;
    local_278.y = local_a8.y;
    local_288.z = local_b4.z;
    local_288.x = local_b4.x;
    local_288.y = local_b4.y;
    local_298 = local_1f0;
    local_2a0 = local_1f8;
    local_2a8 = local_b8;
    local_2b0 = local_c0;
    local_2b8 = local_c8;
    local_2c0 = local_d0;
    local_2d0.z = local_dc.z;
    local_2d0.x = local_dc.x;
    local_2d0.y = local_dc.y;
    local_2e0.z = local_98.z;
    local_2e0.x = local_98.x;
    local_2e0.y = local_98.y;
    local_2f0.z = local_a8.z;
    local_2f0.x = local_a8.x;
    local_2f0.y = local_a8.y;
    local_300.z = local_b4.z;
    local_300.x = local_b4.x;
    local_300.y = local_b4.y;
    vVar3.z = in_stack_fffffffffffffe20;
    vVar3.x = local_290.x;
    vVar3.y = local_290.y;
    vVar5.y = in_stack_fffffffffffffe34;
    vVar5.x = in_stack_fffffffffffffe30;
    vn1.y = in_stack_fffffffffffffe3c;
    vn1.x = fStack_1dc;
    vn1.z = in_stack_fffffffffffffe40;
    vn2.y = (float)in_stack_fffffffffffffe4c;
    vn2.x = in_stack_fffffffffffffe48;
    vn2.z = in_stack_fffffffffffffe50;
    vn3.y = (float)in_stack_fffffffffffffe5c;
    vn3.x = in_stack_fffffffffffffe58;
    vn3.z = in_stack_fffffffffffffe60;
    in_stack_fffffffffffffb68 = local_1f8;
    in_stack_fffffffffffffb70 = local_c0;
    in_stack_fffffffffffffb78 = local_b8;
    key = local_d0;
    fVar4 = local_c8;
    Triangle::Triangle((Triangle *)in_stack_fffffffffffffdb0,vVar3,in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdd8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8
                       ,vVar5,vn1,vn2,vn3);
    local_258 = pTVar2;
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::find<char_const(&)[18]>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT44(in_stack_fffffffffffffb8c,fVar4),key);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffb68);
    bVar1 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)in_stack_fffffffffffffb70,
                         (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)in_stack_fffffffffffffb68);
    if (bVar1) {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
      local_dd = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator_bool<bool,_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)0x1793f4);
    }
    if (local_dd != false) {
      Triangle::recompute_normal(local_258);
    }
    local_10 = local_258;
  }
  if (local_10 != (Triangle *)0x0) {
    return (Primitive *)local_10;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)in_stack_fffffffffffffb68);
  std::operator+((char *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                 in_stack_fffffffffffffb70);
  std::runtime_error::runtime_error(this,local_360);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Primitive* newPrimitive(const Json& conf)
{
	Primitive* shape = NULL;
	if (conf["type"] == "mesh") {
		shape = meshref[conf["file"]];
	}
	if (conf["type"] == "sphere") {
		shape = new Sphere(json2vec3f(conf["origin"]), (double)conf["radius"]);
	}
	if (conf["type"] == "plane") {
		shape = new Plane(json2vec3f(conf["normal"]), (double)conf["offset"]);
	}
	if (conf["type"] == "cube") {
		shape = new Cube();
	}
	if (conf["type"] == "quad") {
		shape = new Quad();
	}
	if (conf["type"] == "revsurface") {
		shape = new RevSurface(conf);
	}
	if (conf["type"] == "triangle") {
		vec3f v1,v2,v3,n1,n2,n3;
		bool recompute_normal = true;
		v1 = json2vec3f(conf["vertices"][0]);
		v2 = json2vec3f(conf["vertices"][1]);
		v3 = json2vec3f(conf["vertices"][2]);
		if (conf.find("normals") != conf.end()) {
			recompute_normal = false;
			n1 = json2vec3f(conf["normals"][0]);
			n2 = json2vec3f(conf["normals"][1]);
			n3 = json2vec3f(conf["normals"][2]);
		}
		vec2f t1,t2,t3;
		if (conf.find("uvs") != conf.end()) {
			t1 = json2vec2f(conf["uvs"][0]);
			t2 = json2vec2f(conf["uvs"][1]);
			t3 = json2vec2f(conf["uvs"][2]);
		}
		Triangle* tshape = new Triangle(v1,v2,v3,t1,t2,t3,n1,n2,n3);
		if (conf.find("recompute_normals") != conf.end())
			recompute_normal = conf["recompute_normals"];
		if (recompute_normal)
			tshape->recompute_normal();
		shape = tshape;
	}
	if (shape == NULL) {
		throw std::runtime_error("Unrecognized Geometric type: " + std::string(conf["type"]));
	}
	return shape;
}